

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O0

VRle __thiscall VRle::opGeneric(VRle *this,VRle *o,Op op)

{
  bool bVar1;
  ssize_t sVar2;
  ulong in_RCX;
  ulong __nbytes;
  size_t __n;
  vcow_ptr<VRle::Data> *in_RDX;
  void *__buf;
  void *__buf_00;
  int iVar3;
  vcow_ptr<VRle::Data> *in_RSI;
  vcow_ptr<VRle::Data> *pvVar4;
  vcow_ptr<VRle::Data> in_RDI;
  undefined1 auVar5 [16];
  VRle *result;
  Op in_stack_000008ac;
  Data *in_stack_000008b0;
  Data *in_stack_000008b8;
  Data *in_stack_000008c0;
  Data *in_stack_ffffffffffffffa8;
  VRle *in_stack_ffffffffffffffb0;
  Data *this_00;
  Data *in_stack_ffffffffffffffc0;
  
  __nbytes = in_RCX;
  pvVar4 = in_RSI;
  bVar1 = empty((VRle *)0x123653);
  iVar3 = (int)pvVar4;
  if (bVar1) {
    VRle(in_stack_ffffffffffffffb0,(VRle *)in_stack_ffffffffffffffa8);
  }
  else {
    bVar1 = empty((VRle *)0x123677);
    if (bVar1) {
      VRle(in_stack_ffffffffffffffb0,(VRle *)in_stack_ffffffffffffffa8);
    }
    else {
      _ZTWL14Scratch_Object();
      Data::reset(in_stack_ffffffffffffffc0);
      auVar5 = _ZTWL14Scratch_Object();
      this_00 = auVar5._0_8_;
      sVar2 = vcow_ptr<VRle::Data>::read(in_RSI,iVar3,auVar5._8_8_,__nbytes);
      vcow_ptr<VRle::Data>::read(in_RDX,iVar3,__buf,__nbytes);
      iVar3 = (int)sVar2;
      __n = in_RCX & 0xffffffff;
      Data::opGeneric(in_stack_000008c0,in_stack_000008b8,in_stack_000008b0,in_stack_000008ac);
      VRle((VRle *)0x1236e6);
      _ZTWL14Scratch_Object();
      vcow_ptr<VRle::Data>::write((vcow_ptr<VRle::Data> *)in_RDI.mModel,iVar3,__buf_00,__n);
      Data::operator=(this_00,in_stack_ffffffffffffffa8);
    }
  }
  return (VRle)(vcow_ptr<VRle::Data>)in_RDI.mModel;
}

Assistant:

VRle VRle::opGeneric(const VRle &o, Data::Op op) const
{
    if (empty()) return o;
    if (o.empty()) return *this;

    Scratch_Object.reset();
    Scratch_Object.opGeneric(d.read(), o.d.read(), op);

    VRle result;
    result.d.write() = Scratch_Object;

    return result;
}